

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator *this,cmGlobalGenerator *gen)

{
  ulong uVar1;
  string *psVar2;
  cmGlobalGenerator *gen_local;
  cmGlobalGenerator *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)&this->ConfiguredFilesPath,(string *)&gen->ConfiguredFilesPath);
  }
  else {
    psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_(gen->CMakeInstance);
    std::__cxx11::string::operator=((string *)&this->ConfiguredFilesPath,(string *)psVar2);
    std::__cxx11::string::operator+=((string *)&this->ConfiguredFilesPath,"/CMakeFiles");
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator* gen)
{
  if (!gen->ConfiguredFilesPath.empty()) {
    this->ConfiguredFilesPath = gen->ConfiguredFilesPath;
  } else {
    this->ConfiguredFilesPath = gen->CMakeInstance->GetHomeOutputDirectory();
    this->ConfiguredFilesPath += "/CMakeFiles";
  }
}